

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_peer_timeout(ENetPeer *peer,enet_uint32 timeoutLimit,enet_uint32 timeoutMinimum,
                      enet_uint32 timeoutMaximum)

{
  enet_uint32 local_28;
  enet_uint32 local_24;
  enet_uint32 local_20;
  enet_uint32 timeoutMaximum_local;
  enet_uint32 timeoutMinimum_local;
  enet_uint32 timeoutLimit_local;
  ENetPeer *peer_local;
  
  local_20 = timeoutLimit;
  if (timeoutLimit == 0) {
    local_20 = 0x20;
  }
  peer->timeoutLimit = local_20;
  local_24 = timeoutMinimum;
  if (timeoutMinimum == 0) {
    local_24 = 5000;
  }
  peer->timeoutMinimum = local_24;
  local_28 = timeoutMaximum;
  if (timeoutMaximum == 0) {
    local_28 = 30000;
  }
  peer->timeoutMaximum = local_28;
  return;
}

Assistant:

void enet_peer_timeout(ENetPeer *peer, enet_uint32 timeoutLimit, enet_uint32 timeoutMinimum, enet_uint32 timeoutMaximum) {
        peer->timeoutLimit   = timeoutLimit ? timeoutLimit : (enet_uint32)ENET_PEER_TIMEOUT_LIMIT;
        peer->timeoutMinimum = timeoutMinimum ? timeoutMinimum : (enet_uint32)ENET_PEER_TIMEOUT_MINIMUM;
        peer->timeoutMaximum = timeoutMaximum ? timeoutMaximum : (enet_uint32)ENET_PEER_TIMEOUT_MAXIMUM;
    }